

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNSubdivPatch1MBlurBuilderSAH<4>::rebuild
          (BVHNSubdivPatch1MBlurBuilderSAH<4> *this,size_t numPrimitives,
          ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pstate
          )

{
  unsigned_long last;
  int iVar1;
  BVHNSubdivPatch1MBlurBuilderSAH<4> *pBVar2;
  undefined4 uVar3;
  char cVar4;
  runtime_error *this_00;
  long lVar5;
  size_t i;
  ulong uVar6;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *this_01;
  anon_class_1_0_00000001 local_309;
  BVHNSubdivPatch1MBlurBuilderSAH<4> *local_308;
  SubdivPatch1 *subdiv_patches;
  size_t taskCount;
  SubdivPatch1 **local_2f0;
  BVHNSubdivPatch1MBlurBuilderSAH<4> *pBStack_2e8;
  SubdivRecalculatePrimRef recalculatePrimRef;
  Iterator<embree::SubdivMesh,_true> *local_2d0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2b8;
  Iterator<embree::SubdivMesh,_true> **local_2b0;
  anon_class_1_0_00000001 *local_2a8;
  BVHNSubdivPatch1MBlurBuilderSAH<4> ***local_2a0;
  undefined1 local_298;
  undefined8 local_290;
  undefined **local_238;
  Scene *local_230;
  Iterator<embree::SubdivMesh,_true> iter;
  BVHNSubdivPatch1MBlurBuilderSAH<4> **local_218;
  Iterator<embree::SubdivMesh,_true> *local_210;
  BVHNodeRecordMB4D<embree::NodeRefPtr<4>_> root;
  BVHNSubdivPatch1MBlurBuilderSAH<4> *local_170;
  SubdivPatch1 **local_168;
  SubdivRecalculatePrimRef *local_160;
  PrimInfoMB pinfo;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  
  subdiv_patches = (SubdivPatch1 *)(this->bvh->subdiv_patches).items;
  recalculatePrimRef.bounds = &this->bounds;
  recalculatePrimRef.patches = subdiv_patches;
  FastAllocator::reset(&this->bvh->alloc);
  iter.scene = this->scene;
  local_2d0 = &iter;
  iter.all = false;
  local_2b8 = &local_c8;
  local_c8._0_8_ = 0x7f8000007f800000;
  local_c8._8_8_ = 0x7f8000007f800000;
  local_b8 = 0xff800000ff800000;
  uStack_b0 = 0xff800000ff800000;
  local_a8 = 0x7f8000007f800000;
  uStack_a0 = 0x7f8000007f800000;
  local_98 = 0xff800000ff800000;
  uStack_90 = 0xff800000ff800000;
  local_88 = 0x7f8000007f800000;
  uStack_80 = 0x7f8000007f800000;
  local_78 = 0xff800000ff800000;
  uStack_70 = 0xff800000ff800000;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_44 = 0x3f8000003f800000;
  local_3c = 0;
  local_218 = &local_170;
  local_2b0 = &local_2d0;
  local_2a0 = &local_218;
  last = (pstate->super_ParallelForForState).taskCount;
  local_2c8._8_8_ = &taskCount;
  local_2a8 = &local_309;
  taskCount = last;
  local_2c8._0_8_ = pstate;
  local_210 = local_2d0;
  local_170 = this;
  local_168 = &subdiv_patches;
  local_160 = &recalculatePrimRef;
  tbb::detail::d1::task_group_context::task_group_context
            ((task_group_context *)&root,(context_traits)0x4,CUSTOM_CTX);
  pinfo.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       &local_2c8;
  tbb::detail::d1::
  parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
            (0,last,1,(anon_class_8_1_898bcfc2_conflict10 *)&pinfo,(task_group_context *)&root);
  cVar4 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&root);
  local_308 = this;
  if (cVar4 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"task cancelled");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&root);
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
            (&pinfo,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_c8.field_1);
  this_01 = (pstate->prefix_state).sums;
  for (uVar6 = 0; pBVar2 = local_308, uVar6 < taskCount; uVar6 = uVar6 + 1) {
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&root,this_01 + -0x40);
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=(this_01,&pinfo);
    rebuild::anon_class_1_0_00000001::operator()
              ((PrimInfoMB *)&local_2c8.field_1,&local_309,&pinfo,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&root);
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
              (&pinfo,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_2c8.field_1);
    this_01 = this_01 + 1;
  }
  pinfo.object_range._end = pinfo.object_range._begin;
  pinfo.object_range._begin = 0;
  local_290 = 0x400;
  local_2c8._0_8_ = 4;
  local_2c8._8_8_ = 0x50;
  for (iVar1 = 0x1f; 4U >> iVar1 == 0; iVar1 = iVar1 + -1) {
  }
  local_2b8 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(long)iVar1;
  local_2b0 = (Iterator<embree::SubdivMesh,_true> **)0x1;
  local_2a8 = (anon_class_1_0_00000001 *)0x1;
  local_2a0 = (BVHNSubdivPatch1MBlurBuilderSAH<4> ***)0x3f8000003f800000;
  local_298 = 0;
  lVar5 = *(long *)&(local_308->scene->super_AccelN).field_0x188;
  if (lVar5 != 0) {
    lVar5 = lVar5 + 0x550;
  }
  local_2f0 = &subdiv_patches;
  pBStack_2e8 = local_308;
  local_238 = &PTR_operator___021d4948;
  local_230 = (local_308->bvh->scene->progressInterface).scene;
  pBStack_2e8._0_4_ = SUB84(local_308,0);
  uVar3 = pBStack_2e8._0_4_;
  pBStack_2e8 = pBVar2;
  BVHBuilderMSMBlur::
  build<embree::NodeRefPtr<4>,embree::sse2::SubdivRecalculatePrimRef,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::BVHNSubdivPatch1MBlurBuilderSAH<4>::rebuild(unsigned_long,embree::ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>>&)::_lambda(embree::sse2::BVHBuilderMSMBlur::BuildRecord_const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::Scene::BuildProgressMonitorInterface>
            (&root,(BVHBuilderMSMBlur *)&local_308->primsMB,&pinfo,lVar5,recalculatePrimRef.bounds,
             recalculatePrimRef.patches,&local_308->bvh->alloc,local_2f0._0_4_,uVar3,&local_238,
             &local_2c8);
  BVHN<4>::set(pBVar2->bvh,(NodeRef)root.ref.ptr,&root.lbounds,pinfo.num_time_segments);
  return;
}

Assistant:

void rebuild(size_t numPrimitives, ParallelForForPrefixSumState<PrimInfoMB>& pstate)
      {
        SubdivPatch1* const subdiv_patches = (SubdivPatch1*) bvh->subdiv_patches.data();
        SubdivRecalculatePrimRef recalculatePrimRef(bounds,subdiv_patches);
        bvh->alloc.reset();

        Scene::Iterator<SubdivMesh,true> iter(scene);
        PrimInfoMB pinfo = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB
        {
          size_t s = 0;
          size_t sMB = 0;
          PrimInfoMB pinfo(empty);
          for (size_t f=r.begin(); f!=r.end(); ++f) 
          {
            if (!mesh->valid(f)) continue;
            
            BVH_Allocator alloc(bvh);
            patch_eval_subdivision(mesh->getHalfEdge(0,f),[&](const Vec2f uv[4], const int subdiv[4], const float edge_level[4], int subPatch)
            {
              const size_t patchIndex = base.begin()+s;
              const size_t patchIndexMB = base.end()+sMB;
              assert(patchIndex < numPrimitives);

              for (size_t t=0; t<mesh->numTimeSteps; t++)
              {
                SubdivPatch1Base& patch = subdiv_patches[patchIndexMB+t];
                new (&patch) SubdivPatch1(unsigned(geomID),unsigned(f),subPatch,mesh,t,uv,edge_level,subdiv,VSIZEX);
              }
              SubdivPatch1Base& patch0 = subdiv_patches[patchIndexMB];
              patch0.root_ref.set((int64_t) GridSOA::create(&patch0,(unsigned)mesh->numTimeSteps,scene,alloc,&bounds[patchIndexMB]));
              primsMB[patchIndex] = recalculatePrimRef(patchIndexMB,mesh->time_range,mesh->numTimeSegments(),BBox1f(0.0f,1.0f));
              s++;
              sMB += mesh->numTimeSteps;
              pinfo.add_primref(primsMB[patchIndex]);
            });
          }
          pinfo.object_range._begin = s;
          pinfo.object_range._end = sMB;
          return pinfo;
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        pinfo.object_range._end = pinfo.begin();
        pinfo.object_range._begin = 0;

        auto createLeafFunc = [&] (const BVHBuilderMSMBlur::BuildRecord& current, const Allocator& alloc) -> NodeRecordMB4D {
          mvector<PrimRefMB>& prims = *current.prims.prims;
          size_t items MAYBE_UNUSED = current.prims.size();
          assert(items == 1);
          const size_t patchIndexMB = prims[current.prims.begin()].ID();
          SubdivPatch1Base& patch = subdiv_patches[patchIndexMB+0];
          NodeRef node = bvh->encodeLeaf((char*)&patch,1);
          size_t patchNumTimeSteps = scene->get<SubdivMesh>(patch.geomID())->numTimeSteps;
          const LBBox3fa lbounds = LBBox3fa([&] (size_t itime) { return bounds[patchIndexMB+itime]; }, current.prims.time_range, (float)(patchNumTimeSteps-1));
          return NodeRecordMB4D(node,lbounds,current.prims.time_range);
        };

        /* configuration for BVH build */
        BVHBuilderMSMBlur::Settings settings;
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxDepth;
        settings.logBlockSize = bsr(N);
        settings.minLeafSize = 1;
        settings.maxLeafSize = 1;
        settings.travCost = 1.0f;
        settings.intCost = 1.0f;
        settings.singleLeafTimeSegment = false;

        /* build hierarchy */
        auto root =
          BVHBuilderMSMBlur::build<NodeRef>(primsMB,pinfo,scene->device,
                                             recalculatePrimRef,
                                             typename BVH::CreateAlloc(bvh),
                                             typename BVH::AABBNodeMB4D::Create(),
                                             typename BVH::AABBNodeMB4D::Set(),
                                             createLeafFunc,
                                             bvh->scene->progressInterface,
                                             settings);
        
        bvh->set(root.ref,root.lbounds,pinfo.num_time_segments);
      }